

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t read_var_sized(archive_read *a,size_t *pvalue,size_t *pvalue_len)

{
  wchar_t local_38;
  uint64_t uStack_30;
  wchar_t ret;
  uint64_t v_size;
  uint64_t v;
  size_t *pvalue_len_local;
  size_t *pvalue_local;
  archive_read *a_local;
  
  uStack_30 = 0;
  v = (uint64_t)pvalue_len;
  pvalue_len_local = pvalue;
  pvalue_local = (size_t *)a;
  if (pvalue_len == (size_t *)0x0) {
    local_38 = read_var(a,&v_size,(uint64_t *)0x0);
  }
  else {
    local_38 = read_var(a,&v_size,&stack0xffffffffffffffd0);
  }
  if ((local_38 == L'\x01') && (pvalue_len_local != (size_t *)0x0)) {
    *pvalue_len_local = v_size;
  }
  if (v != 0) {
    *(uint64_t *)v = uStack_30;
  }
  return local_38;
}

Assistant:

static int read_var_sized(struct archive_read* a, size_t* pvalue,
    size_t* pvalue_len)
{
	uint64_t v;
	uint64_t v_size = 0;

	const int ret = pvalue_len ? read_var(a, &v, &v_size)
				   : read_var(a, &v, NULL);

	if(ret == 1 && pvalue) {
		*pvalue = (size_t) v;
	}

	if(pvalue_len) {
		/* Possible data truncation should be safe. */
		*pvalue_len = (size_t) v_size;
	}

	return ret;
}